

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  size_t *psVar1;
  HandleTable *this_00;
  size_t __n;
  uint32_t hash;
  uint uVar2;
  uint uVar3;
  LRUHandle *pLVar4;
  LRUHandle **ppLVar5;
  LRUHandle *pLVar6;
  Mutex *__mutex;
  LRUCache *this_01;
  Slice local_40;
  
  hash = HashSlice(key);
  uVar2 = hash >> 0x1c;
  this_01 = this->shard_ + uVar2;
  __mutex = &this->shard_[uVar2].mutex_;
  std::mutex::lock(&__mutex->mu_);
  __n = key->size_;
  pLVar4 = (LRUHandle *)malloc(__n + 0x47);
  pLVar4->value = value;
  pLVar4->deleter = deleter;
  pLVar4->charge = charge;
  pLVar4->key_length = __n;
  pLVar4->hash = hash;
  pLVar4->in_cache = false;
  pLVar4->refs = 1;
  memcpy(pLVar4->key_data,key->data_,__n);
  if (this->shard_[uVar2].capacity_ == 0) {
    pLVar4->next = (LRUHandle *)0x0;
  }
  else {
    pLVar4->refs = 2;
    pLVar4->in_cache = true;
    pLVar4->next = &this->shard_[uVar2].in_use_;
    pLVar6 = this->shard_[uVar2].in_use_.prev;
    pLVar4->prev = pLVar6;
    pLVar6->next = pLVar4;
    this->shard_[uVar2].in_use_.prev = pLVar4;
    psVar1 = &this->shard_[uVar2].usage_;
    *psVar1 = *psVar1 + charge;
    this_00 = &this->shard_[uVar2].table_;
    local_40.data_ = pLVar4->key_data;
    local_40.size_ = __n;
    ppLVar5 = HandleTable::FindPointer(this_00,&local_40,hash);
    pLVar6 = *ppLVar5;
    if (pLVar6 == (LRUHandle *)0x0) {
      pLVar4->next_hash = (LRUHandle *)0x0;
      *ppLVar5 = pLVar4;
      uVar3 = this->shard_[uVar2].table_.elems_ + 1;
      this->shard_[uVar2].table_.elems_ = uVar3;
      if (this->shard_[uVar2].table_.length_ < uVar3) {
        HandleTable::Resize(this_00);
      }
    }
    else {
      pLVar4->next_hash = pLVar6->next_hash;
      *ppLVar5 = pLVar4;
    }
    LRUCache::FinishErase(this_01,pLVar6);
  }
  while ((this_01->capacity_ < this->shard_[uVar2].usage_ &&
         (pLVar6 = this->shard_[uVar2].lru_.next, pLVar6 != &this->shard_[uVar2].lru_))) {
    local_40.data_ = pLVar6->key_data;
    local_40.size_ = pLVar6->key_length;
    pLVar6 = HandleTable::Remove(&this->shard_[uVar2].table_,&local_40,pLVar6->hash);
    LRUCache::FinishErase(this_01,pLVar6);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return (Handle *)pLVar4;
}

Assistant:

Handle* Insert(const Slice& key, void* value, size_t charge,
                 void (*deleter)(const Slice& key, void* value)) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
  }